

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O2

bool am_install_match_command(Am_Object *match_command,Am_Object *script_execute_command)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  Am_Value *pAVar6;
  Am_Wrapper *pAVar7;
  Am_Object installed_on_command;
  Am_Object orig_command;
  Am_Object widget;
  Am_Object local_298;
  Am_Object command;
  char line [250];
  ostrstream oss;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"\nInstalling match command ");
  poVar5 = operator<<(poVar5,match_command);
  poVar5 = std::operator<<(poVar5," for ");
  poVar5 = operator<<(poVar5,script_execute_command);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::ostream::flush();
  pAVar6 = Am_Object::Get(match_command,0xc5,0);
  Am_Object::Am_Object(&command,pAVar6);
  orig_command.data = (Am_Object_Data *)0x0;
  installed_on_command.data = (Am_Object_Data *)0x0;
  find_widget_for(&widget,&command);
  poVar5 = std::operator<<((ostream *)&std::cout,"Found widget ");
  poVar5 = operator<<(poVar5,&widget);
  poVar5 = std::operator<<(poVar5," for ");
  poVar5 = operator<<(poVar5,&orig_command);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::ostream::flush();
  pAVar6 = Am_Object::Get(&command,0x175,1);
  bVar2 = Am_Value::Valid(pAVar6);
  AVar1 = Am_WIDGET_FOR_COMMAND;
  if (bVar2) {
    std::ostrstream::ostrstream(&oss,line,0xfa,_S_out);
    poVar5 = std::operator<<((ostream *)&oss,"Sorry, invoking on ANY command not implemented");
    std::ends<char,std::char_traits<char>>(poVar5);
    Am_Pop_Up_Error_Window(line);
    std::ostrstream::~ostrstream(&oss);
  }
  else {
    pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(&widget);
    Am_Object::Set(match_command,AVar1,pAVar7,0);
    AVar1 = Am_SCRIPT_EXECUTE_COMMAND;
    pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(script_execute_command);
    Am_Object::Set(match_command,AVar1,pAVar7,0);
    pAVar6 = Am_Object::Get(match_command,Am_BEFORE_OR_AFTER,0);
    iVar4 = Am_Value::operator_cast_to_int(pAVar6);
    if (iVar4 == 0x34) {
      _oss = am_after_match_do_method.from_wrapper;
      Am_Object::operator=(&installed_on_command,&orig_command);
    }
    else {
      Am_Object::Am_Object(&local_298,&Am_Interactor);
      bVar3 = Am_Object::Is_Instance_Of(&widget,&local_298);
      Am_Object::~Am_Object(&local_298);
      if (bVar3) {
        Am_Object::operator=(&installed_on_command,&widget);
      }
      else {
        find_top_of_impl_chain((Am_Object *)line);
        Am_Object::operator=(&installed_on_command,(Am_Object *)line);
        Am_Object::~Am_Object((Am_Object *)line);
      }
      _oss = am_before_match_do_method.from_wrapper;
    }
    pAVar6 = Am_Object::Get(&installed_on_command,Am_REAL_DO_METHOD,1);
    bVar3 = Am_Value::Valid(pAVar6);
    if (!bVar3) {
      pAVar6 = Am_Object::Get(&installed_on_command,0xca,0);
      Am_Object_Method::Am_Object_Method((Am_Object_Method *)line,pAVar6);
      if (((Am_Method_Wrapper *)line._0_8_ != am_after_match_do_method.from_wrapper) &&
         ((Am_Method_Wrapper *)line._0_8_ != am_before_match_do_method.from_wrapper)) {
        Am_Object::Set(&installed_on_command,Am_REAL_DO_METHOD,(Am_Method_Wrapper *)line._0_8_,1);
      }
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"Setting DO_method of ");
    poVar5 = operator<<(poVar5,&orig_command);
    poVar5 = std::operator<<(poVar5," to ");
    poVar5 = operator<<(poVar5,(Am_Object_Method *)&oss);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::ostream::flush();
    Am_Object::Set(&installed_on_command,0xca,_oss,0);
    AVar1 = Am_INVOKE_MATCH_COMMAND;
    pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(match_command);
    Am_Object::Set(&installed_on_command,AVar1,pAVar7,1);
    AVar1 = Am_ORIG_COMMAND;
    pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(&orig_command);
    Am_Object::Set(match_command,AVar1,pAVar7,0);
    AVar1 = Am_INSTALLED_ON_COMMAND;
    pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(&installed_on_command);
    Am_Object::Set(match_command,AVar1,pAVar7,0);
  }
  Am_Object::~Am_Object(&widget);
  Am_Object::~Am_Object(&installed_on_command);
  Am_Object::~Am_Object(&orig_command);
  Am_Object::~Am_Object(&command);
  return !bVar2;
}

Assistant:

bool
am_install_match_command(Am_Object &match_command,
                         Am_Object &script_execute_command)
{
  std::cout << "\nInstalling match command " << match_command << " for "
            << script_execute_command << std::endl
            << std::flush;
  Am_Object command = match_command.Get(Am_COMMAND);
  Am_Object orig_command, installed_on_command;
  Am_Object widget = find_widget_for(command, orig_command);
  std::cout << "Found widget " << widget << " for " << orig_command << std::endl
            << std::flush;
  if (command.Peek(Am_REGISTER_COMMAND).Valid()) {
    AM_POP_UP_ERROR_WINDOW("Sorry, invoking on ANY command not implemented");
    return false;
  }
  match_command.Set(Am_WIDGET_FOR_COMMAND, widget);
  match_command.Set(Am_SCRIPT_EXECUTE_COMMAND, script_execute_command);
  Am_Object_Method new_method;
  int before_after = match_command.Get(Am_BEFORE_OR_AFTER);
  if (before_after == am_after_command) {
    new_method = am_after_match_do_method;
    installed_on_command = orig_command;
  } else {
    if (widget.Is_Instance_Of(Am_Interactor)) {
      //interactors do the work in the do method of the interactor,
      // instead of in the do method of the command object in the
      // interactor, so have to replace the do method of the interactor itself
      installed_on_command = widget;
    } else
      installed_on_command = find_top_of_impl_chain(orig_command);
    new_method = am_before_match_do_method;
  }
  if (!installed_on_command.Peek(Am_REAL_DO_METHOD).Valid()) {
    Am_Object_Method do_method = installed_on_command.Get(Am_DO_METHOD);
    if (do_method != am_after_match_do_method &&
        do_method != am_before_match_do_method)
      installed_on_command.Set(Am_REAL_DO_METHOD, do_method,
                               Am_OK_IF_NOT_THERE);
  }
  std::cout << "Setting DO_method of " << orig_command << " to " << new_method
            << std::endl
            << std::flush;
  installed_on_command.Set(Am_DO_METHOD, new_method);
  installed_on_command.Set(Am_INVOKE_MATCH_COMMAND, match_command,
                           Am_OK_IF_NOT_THERE);
  match_command.Set(Am_ORIG_COMMAND, orig_command);
  match_command.Set(Am_INSTALLED_ON_COMMAND, installed_on_command);
  return true;
}